

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_false>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  AccelData *pAVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  undefined4 uVar15;
  RTCIntersectFunctionN p_Var16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Geometry *pGVar25;
  ulong uVar26;
  NodeRef nodeRef;
  ulong uVar27;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  vint4 ai_1;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  vint8 bi_1;
  vint<8> octant;
  vint<8> mask;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a0 [32];
  RTCIntersectFunctionNArguments local_1368;
  Geometry *local_1338;
  undefined8 local_1330;
  RTCIntersectArguments *local_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  uint local_12b0;
  uint uStack_12ac;
  uint uStack_12a8;
  uint uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 local_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  float local_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  uint local_11e0;
  uint uStack_11dc;
  uint uStack_11d8;
  uint uStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined1 local_11c0 [32];
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  uint uStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  uint uStack_1164;
  undefined1 local_1160 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_1140;
  undefined4 local_1120;
  undefined4 uStack_111c;
  undefined4 uStack_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  uint uStack_10a4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  uint uStack_fc4;
  undefined1 local_fc0 [32];
  ulong local_fa0;
  Geometry *local_f98;
  ulong local_f90 [492];
  undefined1 auVar63 [64];
  
  local_13a0 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
  auVar57 = ZEXT3264(local_13a0);
  auVar30 = vpcmpeqd_avx2(local_13a0,(undefined1  [32])valid_i->field_0);
  uVar14 = vmovmskps_avx(auVar30);
  if (uVar14 == 0) {
    return;
  }
  local_1140.v = valid_i->field_0;
  pAVar3 = This->ptr;
  uVar18 = (ulong)(uVar14 & 0xff);
  auVar36 = *(undefined1 (*) [32])(ray + 0x80);
  auVar47._8_4_ = 0x7fffffff;
  auVar47._0_8_ = 0x7fffffff7fffffff;
  auVar47._12_4_ = 0x7fffffff;
  auVar47._16_4_ = 0x7fffffff;
  auVar47._20_4_ = 0x7fffffff;
  auVar47._24_4_ = 0x7fffffff;
  auVar47._28_4_ = 0x7fffffff;
  auVar37 = vandps_avx(auVar36,auVar47);
  auVar49._8_4_ = 0x219392ef;
  auVar49._0_8_ = 0x219392ef219392ef;
  auVar49._12_4_ = 0x219392ef;
  auVar49._16_4_ = 0x219392ef;
  auVar49._20_4_ = 0x219392ef;
  auVar49._24_4_ = 0x219392ef;
  auVar49._28_4_ = 0x219392ef;
  auVar37 = vcmpps_avx(auVar37,auVar49,1);
  auVar62 = vblendvps_avx(auVar36,auVar49,auVar37);
  auVar37 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar29 = vandps_avx(auVar37,auVar47);
  auVar29 = vcmpps_avx(auVar29,auVar49,1);
  auVar4 = vblendvps_avx(auVar37,auVar49,auVar29);
  auVar29 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar44 = vandps_avx(auVar29,auVar47);
  auVar44 = vcmpps_avx(auVar44,auVar49,1);
  auVar44 = vblendvps_avx(auVar29,auVar49,auVar44);
  auVar47 = vrcpps_avx(auVar62);
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = 0x3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar51._16_4_ = 0x3f800000;
  auVar51._20_4_ = 0x3f800000;
  auVar51._24_4_ = 0x3f800000;
  auVar51._28_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar62,auVar47,auVar51);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar47,auVar47);
  auVar58 = ZEXT1664(auVar8);
  auVar62 = vrcpps_avx(auVar4);
  auVar9 = vfnmadd213ps_fma(auVar4,auVar62,auVar51);
  auVar4 = vrcpps_avx(auVar44);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar62,auVar62);
  auVar59 = ZEXT1664(auVar9);
  auVar10 = vfnmadd213ps_fma(auVar44,auVar4,auVar51);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar4,auVar4);
  auVar60 = ZEXT1664(auVar10);
  auVar61 = ZEXT816(0) << 0x40;
  auVar63 = ZEXT1664(auVar61);
  local_11c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar61));
  local_1100 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar61));
  local_13a0 = local_13a0 ^ auVar30;
  auVar62 = ZEXT1632(auVar61);
  auVar30 = vcmpps_avx(auVar36,auVar62,1);
  auVar36._8_4_ = 1;
  auVar36._0_8_ = 0x100000001;
  auVar36._12_4_ = 1;
  auVar36._16_4_ = 1;
  auVar36._20_4_ = 1;
  auVar36._24_4_ = 1;
  auVar36._28_4_ = 1;
  auVar30 = vandps_avx(auVar30,auVar36);
  auVar36 = vcmpps_avx(auVar37,auVar62,1);
  auVar44._8_4_ = 2;
  auVar44._0_8_ = 0x200000002;
  auVar44._12_4_ = 2;
  auVar44._16_4_ = 2;
  auVar44._20_4_ = 2;
  auVar44._24_4_ = 2;
  auVar44._28_4_ = 2;
  auVar36 = vandps_avx(auVar36,auVar44);
  auVar36 = vorps_avx(auVar36,auVar30);
  auVar37._8_4_ = 4;
  auVar37._0_8_ = 0x400000004;
  auVar37._12_4_ = 4;
  auVar37._16_4_ = 4;
  auVar37._20_4_ = 4;
  auVar37._24_4_ = 4;
  auVar37._28_4_ = 4;
  auVar30 = vcmpps_avx(auVar29,auVar62,1);
  auVar30 = vandps_avx(auVar30,auVar37);
  auVar30 = vpor_avx2(local_13a0,auVar30);
  local_1160 = vpor_avx2(auVar30,auVar36);
  local_10a0 = *(float *)ray;
  fStack_109c = *(float *)(ray + 4);
  fStack_1098 = *(float *)(ray + 8);
  fStack_1094 = *(float *)(ray + 0xc);
  fStack_1090 = *(float *)(ray + 0x10);
  fStack_108c = *(float *)(ray + 0x14);
  fStack_1088 = *(float *)(ray + 0x18);
  uStack_1084 = *(uint *)(ray + 0x1c);
  uStack_1164 = *(uint *)(ray + 0x1c) ^ 0x80000000;
  local_1180 = auVar8._0_4_ * -*(float *)ray;
  fStack_117c = auVar8._4_4_ * -*(float *)(ray + 4);
  fStack_1178 = auVar8._8_4_ * -*(float *)(ray + 8);
  fStack_1174 = auVar8._12_4_ * -*(float *)(ray + 0xc);
  fStack_1170 = -*(float *)(ray + 0x10) * 0.0;
  fStack_116c = -*(float *)(ray + 0x14) * 0.0;
  fStack_1168 = -*(float *)(ray + 0x18) * 0.0;
  local_10c0 = *(float *)(ray + 0x20);
  fStack_10bc = *(float *)(ray + 0x24);
  fStack_10b8 = *(float *)(ray + 0x28);
  fStack_10b4 = *(float *)(ray + 0x2c);
  fStack_10b0 = *(float *)(ray + 0x30);
  fStack_10ac = *(float *)(ray + 0x34);
  fStack_10a8 = *(float *)(ray + 0x38);
  uStack_10a4 = *(uint *)(ray + 0x3c);
  uStack_1184 = *(uint *)(ray + 0x3c) ^ 0x80000000;
  local_11a0 = auVar9._0_4_ * -*(float *)(ray + 0x20);
  fStack_119c = auVar9._4_4_ * -*(float *)(ray + 0x24);
  fStack_1198 = auVar9._8_4_ * -*(float *)(ray + 0x28);
  fStack_1194 = auVar9._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1190 = -*(float *)(ray + 0x30) * 0.0;
  fStack_118c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1188 = -*(float *)(ray + 0x38) * 0.0;
  local_10e0 = *(float *)(ray + 0x40);
  fStack_10dc = *(float *)(ray + 0x44);
  fStack_10d8 = *(float *)(ray + 0x48);
  fStack_10d4 = *(float *)(ray + 0x4c);
  fStack_10d0 = *(float *)(ray + 0x50);
  fStack_10cc = *(float *)(ray + 0x54);
  fStack_10c8 = *(float *)(ray + 0x58);
  uStack_10c4 = *(uint *)(ray + 0x5c);
  local_1000 = mm_lookupmask_ps._16_8_;
  uStack_ff8 = mm_lookupmask_ps._24_8_;
  uStack_ff0 = mm_lookupmask_ps._16_8_;
  uStack_fe8 = mm_lookupmask_ps._24_8_;
  local_fe0 = auVar10._0_4_ * -*(float *)(ray + 0x40);
  fStack_fdc = auVar10._4_4_ * -*(float *)(ray + 0x44);
  fStack_fd8 = auVar10._8_4_ * -*(float *)(ray + 0x48);
  fStack_fd4 = auVar10._12_4_ * -*(float *)(ray + 0x4c);
  fStack_fd0 = -*(float *)(ray + 0x50) * 0.0;
  fStack_fcc = -*(float *)(ray + 0x54) * 0.0;
  fStack_fc8 = -*(float *)(ray + 0x58) * 0.0;
  uStack_fc4 = *(uint *)(ray + 0x5c) ^ 0x80000000;
  local_12b0 = 0x80000000;
  uStack_12ac = 0x80000000;
  uStack_12a8 = 0x80000000;
  uStack_12a4 = 0x80000000;
  local_1120 = 0x7f800000;
  uStack_111c = 0x7f800000;
  uStack_1118 = 0x7f800000;
  uStack_1114 = 0x7f800000;
  uStack_1110 = 0x7f800000;
  uStack_110c = 0x7f800000;
  uStack_1108 = 0x7f800000;
  uStack_1104 = 0x7f800000;
  local_1040 = ZEXT1632(auVar8);
  local_1060 = ZEXT1632(auVar9);
  local_1080 = ZEXT1632(auVar10);
  do {
    lVar7 = 0;
    for (uVar17 = uVar18; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
      lVar7 = lVar7 + 1;
    }
    uVar15 = *(undefined4 *)(local_1160 + lVar7 * 4);
    auVar29._4_4_ = uVar15;
    auVar29._0_4_ = uVar15;
    auVar29._8_4_ = uVar15;
    auVar29._12_4_ = uVar15;
    auVar29._16_4_ = uVar15;
    auVar29._20_4_ = uVar15;
    auVar29._24_4_ = uVar15;
    auVar29._28_4_ = uVar15;
    auVar29 = vpcmpeqd_avx2(auVar29,local_1160);
    uVar15 = vmovmskps_avx(auVar29);
    local_1338 = (Geometry *)CONCAT44((int)((ulong)lVar7 >> 0x20),uVar15);
    auVar12._4_4_ = fStack_109c;
    auVar12._0_4_ = local_10a0;
    auVar12._8_4_ = fStack_1098;
    auVar12._12_4_ = fStack_1094;
    auVar12._16_4_ = fStack_1090;
    auVar12._20_4_ = fStack_108c;
    auVar12._24_4_ = fStack_1088;
    auVar12._28_4_ = uStack_1084;
    auVar52._8_4_ = 0x7f800000;
    auVar52._0_8_ = 0x7f8000007f800000;
    auVar52._12_4_ = 0x7f800000;
    auVar52._16_4_ = 0x7f800000;
    auVar52._20_4_ = 0x7f800000;
    auVar52._24_4_ = 0x7f800000;
    auVar52._28_4_ = 0x7f800000;
    auVar30 = vblendvps_avx(auVar52,auVar12,auVar29);
    uVar18 = ~(ulong)local_1338 & uVar18;
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar36 = vminps_avx(auVar30,auVar36);
    auVar4._4_4_ = fStack_10bc;
    auVar4._0_4_ = local_10c0;
    auVar4._8_4_ = fStack_10b8;
    auVar4._12_4_ = fStack_10b4;
    auVar4._16_4_ = fStack_10b0;
    auVar4._20_4_ = fStack_10ac;
    auVar4._24_4_ = fStack_10a8;
    auVar4._28_4_ = uStack_10a4;
    auVar30 = vblendvps_avx(auVar52,auVar4,auVar29);
    auVar8 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar9 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar9 = vunpcklps_avx(auVar8,auVar9);
    auVar62._4_4_ = fStack_10dc;
    auVar62._0_4_ = local_10e0;
    auVar62._8_4_ = fStack_10d8;
    auVar62._12_4_ = fStack_10d4;
    auVar62._16_4_ = fStack_10d0;
    auVar62._20_4_ = fStack_10cc;
    auVar62._24_4_ = fStack_10c8;
    auVar62._28_4_ = uStack_10c4;
    auVar30 = vblendvps_avx(auVar52,auVar62,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar8 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar10 = vinsertps_avx(auVar9,auVar8,0x28);
    auVar53._8_4_ = 0xff800000;
    auVar53._0_8_ = 0xff800000ff800000;
    auVar53._12_4_ = 0xff800000;
    auVar53._16_4_ = 0xff800000;
    auVar53._20_4_ = 0xff800000;
    auVar53._24_4_ = 0xff800000;
    auVar53._28_4_ = 0xff800000;
    auVar30 = vblendvps_avx(auVar53,auVar12,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar8 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar30 = vblendvps_avx(auVar53,auVar4,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar9 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar9 = vunpcklps_avx(auVar8,auVar9);
    auVar30 = vblendvps_avx(auVar53,auVar62,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar8 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar30 = vblendvps_avx(auVar52,auVar58._0_32_,auVar29);
    auVar5 = vinsertps_avx(auVar9,auVar8,0x28);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar36 = vminps_avx(auVar30,auVar36);
    auVar30 = vblendvps_avx(auVar52,auVar59._0_32_,auVar29);
    auVar8 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar9 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar9 = vunpcklps_avx(auVar8,auVar9);
    auVar30 = vblendvps_avx(auVar52,auVar60._0_32_,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar8 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar41 = vinsertps_avx(auVar9,auVar8,0x28);
    auVar30 = vblendvps_avx(auVar53,auVar58._0_32_,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar8 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar30 = vblendvps_avx(auVar53,auVar59._0_32_,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar9 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar9 = vunpcklps_avx(auVar8,auVar9);
    auVar30 = vblendvps_avx(auVar53,auVar60._0_32_,auVar29);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vmaxps_avx(auVar30,auVar36);
    auVar8 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar30 = vblendvps_avx(auVar52,local_11c0,auVar29);
    auVar46 = vinsertps_avx(auVar9,auVar8,0x28);
    auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
    auVar30 = vminps_avx(auVar30,auVar36);
    auVar36 = vshufpd_avx(auVar30,auVar30,5);
    auVar36 = vminps_avx(auVar30,auVar36);
    local_12e0 = vblendvps_avx(auVar53,local_1100,auVar29);
    auVar30 = vshufps_avx(local_12e0,local_12e0,0xb1);
    auVar30 = vmaxps_avx(local_12e0,auVar30);
    auVar37 = vshufpd_avx(auVar30,auVar30,5);
    auVar61 = vcmpps_avx(auVar41,_DAT_01f7aa10,5);
    auVar8 = vblendvps_avx(auVar46,auVar41,auVar61);
    auVar9 = vblendvps_avx(auVar10,auVar5,auVar61);
    auVar30 = vmaxps_avx(auVar30,auVar37);
    auVar10 = vblendvps_avx(auVar5,auVar10,auVar61);
    local_11d0 = auVar8._0_4_;
    auVar5 = vmovshdup_avx(auVar8);
    uVar22 = (ulong)(auVar5._0_4_ < 0.0) << 4 | 0x20;
    auVar5 = vshufpd_avx(auVar8,auVar8,1);
    uVar17 = (ulong)(auVar5._0_4_ < 0.0) << 4 | 0x40;
    auVar6 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
    auVar5 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
    auVar61 = vblendvps_avx(auVar41,auVar46,auVar61);
    auVar46._0_4_ = auVar9._0_4_ * local_11d0;
    auVar46._4_4_ = auVar9._4_4_ * auVar8._4_4_;
    auVar46._8_4_ = auVar9._8_4_ * auVar8._8_4_;
    auVar46._12_4_ = auVar9._12_4_ * auVar8._12_4_;
    local_1230 = auVar61._0_4_;
    auVar41._0_4_ = auVar10._0_4_ * local_1230;
    auVar41._4_4_ = auVar10._4_4_ * auVar61._4_4_;
    auVar41._8_4_ = auVar10._8_4_ * auVar61._8_4_;
    auVar41._12_4_ = auVar10._12_4_ * auVar61._12_4_;
    uVar27 = (ulong)(local_11d0 < 0.0) * 0x10;
    local_fa0 = *(ulong *)&pAVar3[1].bounds.bounds0.lower.field_0;
    local_f98 = local_1338;
    local_11e0 = (uint)auVar46._0_4_ ^ local_12b0;
    uStack_11dc = (uint)auVar46._0_4_ ^ uStack_12ac;
    uStack_11d8 = (uint)auVar46._0_4_ ^ uStack_12a8;
    uStack_11d4 = (uint)auVar46._0_4_ ^ uStack_12a4;
    local_11f0 = vshufps_avx(auVar8,auVar8,0x55);
    auVar9 = vshufps_avx(auVar46,auVar46,0x55);
    local_1200._0_4_ = auVar9._0_4_ ^ local_12b0;
    local_1200._4_4_ = auVar9._4_4_ ^ uStack_12ac;
    local_1200._8_4_ = auVar9._8_4_ ^ uStack_12a8;
    local_1200._12_4_ = auVar9._12_4_ ^ uStack_12a4;
    local_1210 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar8 = vshufps_avx(auVar46,auVar46,0xaa);
    local_1220 = auVar8._0_4_ ^ local_12b0;
    uStack_121c = auVar8._4_4_ ^ uStack_12ac;
    uStack_1218 = auVar8._8_4_ ^ uStack_12a8;
    uStack_1214 = auVar8._12_4_ ^ uStack_12a4;
    local_1240 = (uint)auVar41._0_4_ ^ local_12b0;
    uStack_123c = (uint)auVar41._0_4_ ^ uStack_12ac;
    uStack_1238 = (uint)auVar41._0_4_ ^ uStack_12a8;
    uStack_1234 = (uint)auVar41._0_4_ ^ uStack_12a4;
    local_1250 = vshufps_avx(auVar61,auVar61,0x55);
    auVar8 = vshufps_avx(auVar41,auVar41,0x55);
    local_1260._0_4_ = auVar8._0_4_ ^ local_12b0;
    local_1260._4_4_ = auVar8._4_4_ ^ uStack_12ac;
    local_1260._8_4_ = auVar8._8_4_ ^ uStack_12a8;
    local_1260._12_4_ = auVar8._12_4_ ^ uStack_12a4;
    local_1270 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar8 = vshufps_avx(auVar41,auVar41,0xaa);
    local_1280._0_4_ = auVar8._0_4_ ^ local_12b0;
    local_1280._4_4_ = auVar8._4_4_ ^ uStack_12ac;
    local_1280._8_4_ = auVar8._8_4_ ^ uStack_12a8;
    local_1280._12_4_ = auVar8._12_4_ ^ uStack_12a4;
    local_1290 = auVar6._0_4_;
    local_12a0 = auVar5._0_4_;
    puVar19 = local_f90;
    auVar30._4_4_ = uStack_111c;
    auVar30._0_4_ = local_1120;
    auVar30._8_4_ = uStack_1118;
    auVar30._12_4_ = uStack_1114;
    auVar30._16_4_ = uStack_1110;
    auVar30._20_4_ = uStack_110c;
    auVar30._24_4_ = uStack_1108;
    auVar30._28_4_ = uStack_1104;
    local_1300 = vblendvps_avx(auVar30,local_11c0,auVar29);
    auVar35 = ZEXT3264(auVar29);
    auVar54 = ZEXT3264(local_13a0);
    auVar55 = ZEXT3264(CONCAT428(uStack_1164,
                                 CONCAT424(fStack_1168,
                                           CONCAT420(fStack_116c,
                                                     CONCAT416(fStack_1170,
                                                               CONCAT412(fStack_1174,
                                                                         CONCAT48(fStack_1178,
                                                                                  CONCAT44(
                                                  fStack_117c,local_1180))))))));
    auVar56 = ZEXT3264(CONCAT428(uStack_1184,
                                 CONCAT424(fStack_1188,
                                           CONCAT420(fStack_118c,
                                                     CONCAT416(fStack_1190,
                                                               CONCAT412(fStack_1194,
                                                                         CONCAT48(fStack_1198,
                                                                                  CONCAT44(
                                                  fStack_119c,local_11a0))))))));
    uStack_129c = local_12a0;
    uStack_1298 = local_12a0;
    uStack_1294 = local_12a0;
    uStack_128c = local_1290;
    uStack_1288 = local_1290;
    uStack_1284 = local_1290;
    fStack_122c = local_1230;
    fStack_1228 = local_1230;
    fStack_1224 = local_1230;
    fStack_11cc = local_11d0;
    fStack_11c8 = local_11d0;
    fStack_11c4 = local_11d0;
    do {
      local_13a0 = auVar54._0_32_;
      uVar15 = vmovmskps_avx(local_13a0);
      local_1338 = (Geometry *)~CONCAT44((int)((ulong)local_1338 >> 0x20),uVar15);
      auVar30 = auVar35._0_32_;
      while( true ) {
        puVar1 = puVar19 + -2;
        puVar2 = puVar19 + -1;
        puVar19 = puVar1;
        if ((*puVar2 & (ulong)local_1338) == 0) goto LAB_00594e45;
        uVar24 = *puVar1;
        uVar21 = uVar24;
        if ((uVar24 & 8) != 0) break;
        while( true ) {
          auVar8._4_4_ = uStack_11dc;
          auVar8._0_4_ = local_11e0;
          auVar8._8_4_ = uStack_11d8;
          auVar8._12_4_ = uStack_11d4;
          auVar11._4_4_ = fStack_11cc;
          auVar11._0_4_ = local_11d0;
          auVar11._8_4_ = fStack_11c8;
          auVar11._12_4_ = fStack_11c4;
          auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar27),auVar8,auVar11);
          auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar22),local_1200,
                                   local_11f0);
          auVar8 = vpmaxsd_avx(auVar8,auVar9);
          auVar6._4_4_ = uStack_121c;
          auVar6._0_4_ = local_1220;
          auVar6._8_4_ = uStack_1218;
          auVar6._12_4_ = uStack_1214;
          auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar17),auVar6,local_1210)
          ;
          auVar10._4_4_ = uStack_128c;
          auVar10._0_4_ = local_1290;
          auVar10._8_4_ = uStack_1288;
          auVar10._12_4_ = uStack_1284;
          auVar9 = vpmaxsd_avx(auVar9,auVar10);
          auVar8 = vpmaxsd_avx(auVar8,auVar9);
          auVar9._4_4_ = uStack_123c;
          auVar9._0_4_ = local_1240;
          auVar9._8_4_ = uStack_1238;
          auVar9._12_4_ = uStack_1234;
          auVar5._4_4_ = fStack_122c;
          auVar5._0_4_ = local_1230;
          auVar5._8_4_ = fStack_1228;
          auVar5._12_4_ = fStack_1224;
          auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar27 ^ 0x10)),auVar9,
                                   auVar5);
          auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar22 ^ 0x10)),
                                    local_1260,local_1250);
          auVar9 = vpminsd_avx(auVar9,auVar10);
          auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar17 ^ 0x10)),
                                    local_1280,local_1270);
          auVar61._4_4_ = uStack_129c;
          auVar61._0_4_ = local_12a0;
          auVar61._8_4_ = uStack_1298;
          auVar61._12_4_ = uStack_1294;
          auVar10 = vpminsd_avx(auVar10,auVar61);
          auVar9 = vpminsd_avx(auVar9,auVar10);
          auVar8 = vcmpps_avx(auVar8,auVar9,2);
          uVar14 = vmovmskps_avx(auVar8);
          if (uVar14 == 0) break;
          uVar26 = (ulong)(uVar14 & 0xff);
          uVar20 = 0;
          uVar23 = 8;
          do {
            lVar7 = 0;
            for (uVar24 = uVar26; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar15 = *(undefined4 *)(uVar21 + 0x20 + lVar7 * 4);
            auVar31._4_4_ = uVar15;
            auVar31._0_4_ = uVar15;
            auVar31._8_4_ = uVar15;
            auVar31._12_4_ = uVar15;
            auVar31._16_4_ = uVar15;
            auVar31._20_4_ = uVar15;
            auVar31._24_4_ = uVar15;
            auVar31._28_4_ = uVar15;
            uVar15 = *(undefined4 *)(uVar21 + 0x40 + lVar7 * 4);
            auVar38._4_4_ = uVar15;
            auVar38._0_4_ = uVar15;
            auVar38._8_4_ = uVar15;
            auVar38._12_4_ = uVar15;
            auVar38._16_4_ = uVar15;
            auVar38._20_4_ = uVar15;
            auVar38._24_4_ = uVar15;
            auVar38._28_4_ = uVar15;
            auVar8 = vfmadd213ps_fma(auVar31,auVar58._0_32_,auVar55._0_32_);
            auVar9 = vfmadd213ps_fma(auVar38,auVar59._0_32_,auVar56._0_32_);
            uVar15 = *(undefined4 *)(uVar21 + 0x60 + lVar7 * 4);
            auVar42._4_4_ = uVar15;
            auVar42._0_4_ = uVar15;
            auVar42._8_4_ = uVar15;
            auVar42._12_4_ = uVar15;
            auVar42._16_4_ = uVar15;
            auVar42._20_4_ = uVar15;
            auVar42._24_4_ = uVar15;
            auVar42._28_4_ = uVar15;
            auVar13._4_4_ = fStack_fdc;
            auVar13._0_4_ = local_fe0;
            auVar13._8_4_ = fStack_fd8;
            auVar13._12_4_ = fStack_fd4;
            auVar13._16_4_ = fStack_fd0;
            auVar13._20_4_ = fStack_fcc;
            auVar13._24_4_ = fStack_fc8;
            auVar13._28_4_ = uStack_fc4;
            auVar10 = vfmadd213ps_fma(auVar42,auVar60._0_32_,auVar13);
            uVar15 = *(undefined4 *)(uVar21 + 0x30 + lVar7 * 4);
            auVar45._4_4_ = uVar15;
            auVar45._0_4_ = uVar15;
            auVar45._8_4_ = uVar15;
            auVar45._12_4_ = uVar15;
            auVar45._16_4_ = uVar15;
            auVar45._20_4_ = uVar15;
            auVar45._24_4_ = uVar15;
            auVar45._28_4_ = uVar15;
            auVar61 = vfmadd213ps_fma(auVar45,auVar58._0_32_,auVar55._0_32_);
            uVar15 = *(undefined4 *)(uVar21 + 0x50 + lVar7 * 4);
            auVar48._4_4_ = uVar15;
            auVar48._0_4_ = uVar15;
            auVar48._8_4_ = uVar15;
            auVar48._12_4_ = uVar15;
            auVar48._16_4_ = uVar15;
            auVar48._20_4_ = uVar15;
            auVar48._24_4_ = uVar15;
            auVar48._28_4_ = uVar15;
            uVar15 = *(undefined4 *)(uVar21 + 0x70 + lVar7 * 4);
            auVar50._4_4_ = uVar15;
            auVar50._0_4_ = uVar15;
            auVar50._8_4_ = uVar15;
            auVar50._12_4_ = uVar15;
            auVar50._16_4_ = uVar15;
            auVar50._20_4_ = uVar15;
            auVar50._24_4_ = uVar15;
            auVar50._28_4_ = uVar15;
            auVar5 = vfmadd213ps_fma(auVar48,auVar59._0_32_,auVar56._0_32_);
            auVar41 = vfmadd213ps_fma(auVar50,auVar60._0_32_,auVar13);
            auVar36 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar61));
            auVar37 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
            auVar36 = vpmaxsd_avx2(auVar36,auVar37);
            auVar37 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar41));
            auVar37 = vpmaxsd_avx2(auVar37,local_1300);
            auVar36 = vpmaxsd_avx2(auVar36,auVar37);
            auVar37 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar61));
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
            auVar29 = vpminsd_avx2(auVar37,auVar29);
            auVar37 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar41));
            auVar37 = vpminsd_avx2(auVar37,local_12e0);
            auVar37 = vpminsd_avx2(auVar29,auVar37);
            auVar36 = vcmpps_avx(auVar36,auVar37,2);
            uVar24 = uVar23;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0x7f,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0xbf,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar36[0x1f] < '\0') {
              uVar24 = *(ulong *)(uVar21 + lVar7 * 8);
              if (uVar23 != 8) {
                *puVar19 = uVar23;
                puVar19[1] = uVar20;
                puVar19 = puVar19 + 2;
              }
              uVar14 = vmovmskps_avx(auVar36);
              uVar20 = (ulong)uVar14;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar23 = uVar24;
          } while (uVar26 != 0);
          if (uVar24 == 8) break;
          uVar21 = uVar24;
          if ((uVar24 & 8) != 0) {
            if (uVar20 != 0) goto LAB_00594c6b;
            auVar35 = ZEXT3264(auVar30);
            goto LAB_00594e45;
          }
        }
        auVar35 = ZEXT3264(auVar30);
        if (puVar19 == &local_fa0) goto LAB_00594e5b;
      }
LAB_00594c6b:
      uVar21 = (ulong)((uint)uVar24 & 0xf);
      auVar36 = local_13a0;
      auVar33 = local_13a0;
      local_1320 = auVar30;
      if (uVar21 != 8) {
        auVar43._0_4_ = auVar54._0_4_ ^ auVar57._0_4_;
        auVar43._4_4_ = auVar54._4_4_ ^ auVar57._4_4_;
        auVar43._8_4_ = auVar54._8_4_ ^ auVar57._8_4_;
        auVar43._12_4_ = auVar54._12_4_ ^ auVar57._12_4_;
        auVar43._16_4_ = auVar54._16_4_ ^ auVar57._16_4_;
        auVar43._20_4_ = auVar54._20_4_ ^ auVar57._20_4_;
        auVar43._24_4_ = auVar54._24_4_ ^ auVar57._24_4_;
        auVar43._28_4_ = auVar54._28_4_ ^ auVar57._28_4_;
        pGVar25 = (Geometry *)0x1;
        do {
          local_1368.geomID = *(uint *)(((uVar24 & 0xfffffffffffffff0) - 8) + (long)pGVar25 * 8);
          local_1338 = (context->scene->geometries).items[local_1368.geomID].ptr;
          uVar14 = local_1338->mask;
          auVar32._4_4_ = uVar14;
          auVar32._0_4_ = uVar14;
          auVar32._8_4_ = uVar14;
          auVar32._12_4_ = uVar14;
          auVar32._16_4_ = uVar14;
          auVar32._20_4_ = uVar14;
          auVar32._24_4_ = uVar14;
          auVar32._28_4_ = uVar14;
          auVar30 = vpand_avx2(auVar32,*(undefined1 (*) [32])(ray + 0x120));
          auVar36 = vpcmpeqd_avx2(auVar63._0_32_,auVar30);
          auVar30 = auVar43 & ~auVar36;
          auVar39._8_8_ = uStack_ff8;
          auVar39._0_8_ = local_1000;
          auVar39._16_8_ = uStack_ff0;
          auVar39._24_8_ = uStack_fe8;
          local_1020 = auVar43;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            local_fc0 = vandnps_avx(auVar36,auVar43);
            local_1368.primID = *(uint *)(((uVar24 & 0xfffffffffffffff0) - 4) + (long)pGVar25 * 8);
            local_1368.valid = (int *)local_fc0;
            local_1368.geometryUserPtr = local_1338->userPtr;
            local_1368.context = context->user;
            local_1368.N = 8;
            local_1330 = 0;
            local_1328 = context->args;
            p_Var16 = local_1328->intersect;
            if (p_Var16 == (RTCIntersectFunctionN)0x0) {
              p_Var16 = (RTCIntersectFunctionN)
                        local_1338[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            auVar30 = ZEXT1632(auVar57._0_16_);
            local_1368.rayhit = (RTCRayHitN *)ray;
            local_1338 = (Geometry *)(*p_Var16)(&local_1368);
            auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar39 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),1)
            ;
            auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
            auVar57 = ZEXT3264(auVar30);
            auVar58 = ZEXT3264(local_1040);
            auVar59 = ZEXT3264(local_1060);
            auVar60 = ZEXT3264(local_1080);
            auVar54 = ZEXT3264(local_13a0);
            auVar55 = ZEXT3264(CONCAT428(uStack_1164,
                                         CONCAT424(fStack_1168,
                                                   CONCAT420(fStack_116c,
                                                             CONCAT416(fStack_1170,
                                                                       CONCAT412(fStack_1174,
                                                                                 CONCAT48(
                                                  fStack_1178,CONCAT44(fStack_117c,local_1180)))))))
                              );
            auVar56 = ZEXT3264(CONCAT428(uStack_1184,
                                         CONCAT424(fStack_1188,
                                                   CONCAT420(fStack_118c,
                                                             CONCAT416(fStack_1190,
                                                                       CONCAT412(fStack_1194,
                                                                                 CONCAT48(
                                                  fStack_1198,CONCAT44(fStack_119c,local_11a0)))))))
                              );
          }
          auVar36 = auVar54._0_32_;
          auVar43 = vandnps_avx(auVar39,local_1020);
          local_1020 = local_1020 & ~auVar39;
        } while (((((((((local_1020 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1020 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1020 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1020 >> 0x7f,0) != '\0') ||
                    (local_1020 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1020 >> 0xbf,0) != '\0') ||
                  (local_1020 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1020[0x1f] < '\0') &&
                (local_1338 = (Geometry *)((long)&(pGVar25->super_RefCount)._vptr_RefCount + 1),
                bVar28 = pGVar25 < (Geometry *)(uVar21 - 8), pGVar25 = local_1338, bVar28));
        auVar33._0_4_ = auVar57._0_4_ ^ auVar43._0_4_;
        auVar33._4_4_ = auVar57._4_4_ ^ auVar43._4_4_;
        auVar33._8_4_ = auVar57._8_4_ ^ auVar43._8_4_;
        auVar33._12_4_ = auVar57._12_4_ ^ auVar43._12_4_;
        auVar33._16_4_ = auVar57._16_4_ ^ auVar43._16_4_;
        auVar33._20_4_ = auVar57._20_4_ ^ auVar43._20_4_;
        auVar33._24_4_ = auVar57._24_4_ ^ auVar43._24_4_;
        auVar33._28_4_ = auVar57._28_4_ ^ auVar43._28_4_;
      }
      local_13a0 = vorps_avx(auVar36,auVar33);
      auVar54 = ZEXT3264(local_13a0);
      auVar36 = local_1320 & ~local_13a0;
      auVar30 = auVar33;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar36 >> 0x7f,0) == '\0') &&
            (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0xbf,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f])
      break;
      auVar30 = vandnps_avx(local_13a0,local_1320);
      auVar34._8_4_ = 0xff800000;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = 0xff800000;
      auVar34._16_4_ = 0xff800000;
      auVar34._20_4_ = 0xff800000;
      auVar34._24_4_ = 0xff800000;
      auVar34._28_4_ = 0xff800000;
      local_12e0 = vblendvps_avx(local_12e0,auVar34,local_13a0);
      auVar35 = ZEXT3264(auVar30);
LAB_00594e45:
      auVar30 = auVar35._0_32_;
      local_13a0 = auVar54._0_32_;
    } while (puVar19 != &local_fa0);
LAB_00594e5b:
    if (uVar18 == 0) {
      auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
      auVar30 = vpcmpeqd_avx2(auVar30,(undefined1  [32])local_1140);
      auVar30 = vpand_avx2(auVar30,local_13a0);
      auVar40._8_4_ = 0xff800000;
      auVar40._0_8_ = 0xff800000ff800000;
      auVar40._12_4_ = 0xff800000;
      auVar40._16_4_ = 0xff800000;
      auVar40._20_4_ = 0xff800000;
      auVar40._24_4_ = 0xff800000;
      auVar40._28_4_ = 0xff800000;
      auVar30 = vmaskmovps_avx(auVar30,auVar40);
      *(undefined1 (*) [32])(ray + 0x100) = auVar30;
      return;
    }
  } while( true );
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }